

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O2

void wallet::wallet_crypto_tests::TestCrypter::TestPassphraseSingle
               (span<const_unsigned_char,_18446744073709551615UL> salt,SecureString *passphrase,
               uint32_t rounds,span<const_unsigned_char,_18446744073709551615UL> correct_key,
               span<const_unsigned_char,_18446744073709551615UL> correct_iv)

{
  int iVar1;
  iterator pvVar2;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  Span<const_unsigned_char> s_00;
  check_type cVar4;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  allocator<char> local_169;
  lazy_ostream local_168;
  undefined1 *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  assertion_result local_148;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  CCrypter crypt;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CCrypter::CCrypter(&crypt);
  pvVar2 = (iterator)(ulong)rounds;
  pvVar3 = (iterator)0x0;
  CCrypter::SetKeyFromPassphrase(&crypt,passphrase,salt,rounds,0);
  if (correct_key._M_extent._M_extent_value._M_extent_value != 0) {
    local_120 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_118 = "";
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    local_128 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = pvVar3;
    msg.m_begin = pvVar2;
    file.m_end = (iterator)0x1f;
    file.m_begin = (iterator)&local_120;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_130,msg);
    iVar1 = bcmp(crypt.vchKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,correct_key._M_ptr,
                 (long)crypt.vchKey.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)crypt.vchKey.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    s.m_size = (long)crypt.vchKey.
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)crypt.vchKey.
                     super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
    s.m_data = crypt.vchKey.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_98,s);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8," != ",&local_169);
    std::operator+(&local_78,&local_98,&local_b8);
    HexStr_abi_cxx11_(&local_d8,(Span<const_unsigned_char>)correct_key);
    std::operator+(&local_58,&local_78,&local_d8);
    local_168.m_empty = false;
    local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_180 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_178 = "";
    pvVar2 = &DAT_00000001;
    pvVar3 = &DAT_00000001;
    local_150 = &local_58;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,&local_168,1,1,WARN,_cVar4,(size_t)&local_180,0x1f);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  }
  if (correct_iv._M_extent._M_extent_value != 0) {
    local_190 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar3;
    msg_00.m_begin = pvVar2;
    file_00.m_end = (iterator)0x23;
    file_00.m_begin = (iterator)&local_190;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1a0,
               msg_00);
    iVar1 = bcmp(crypt.vchIV.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,correct_iv._M_ptr,
                 (long)crypt.vchIV.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)crypt.vchIV.
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(iVar1 == 0);
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    s_00.m_size = (long)crypt.vchIV.
                        super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)crypt.vchIV.
                        super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
    s_00.m_data = crypt.vchIV.super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    HexStr_abi_cxx11_(&local_98,s_00);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8," != ",&local_169);
    std::operator+(&local_78,&local_98,&local_b8);
    HexStr_abi_cxx11_(&local_d8,(Span<const_unsigned_char>)correct_iv);
    std::operator+(&local_58,&local_78,&local_d8);
    local_168.m_empty = false;
    local_168._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01139e30;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_1b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_crypto_tests.cpp"
    ;
    local_1a8 = "";
    local_150 = &local_58;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,&local_168,1,1,WARN,_cVar4,(size_t)&local_1b0,0x23);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_98);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
  }
  CCrypter::~CCrypter(&crypt);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void TestPassphraseSingle(const std::span<const unsigned char> salt, const SecureString& passphrase, uint32_t rounds,
                                 const std::span<const unsigned char> correct_key = {},
                                 const std::span<const unsigned char> correct_iv = {})
{
    CCrypter crypt;
    crypt.SetKeyFromPassphrase(passphrase, salt, rounds, 0);

    if (!correct_key.empty()) {
        BOOST_CHECK_MESSAGE(memcmp(crypt.vchKey.data(), correct_key.data(), crypt.vchKey.size()) == 0,
            HexStr(crypt.vchKey) + std::string(" != ") + HexStr(correct_key));
    }
    if (!correct_iv.empty()) {
        BOOST_CHECK_MESSAGE(memcmp(crypt.vchIV.data(), correct_iv.data(), crypt.vchIV.size()) == 0,
            HexStr(crypt.vchIV) + std::string(" != ") + HexStr(correct_iv));
    }
}